

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O1

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hash
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint64_t seed)

{
  ValueLength len;
  XXH64_hash_t XVar1;
  
  len = (ValueLength)"\x01\x01"[**(byte **)this];
  if (len == 0) {
    len = byteSizeDynamic(this,*(byte **)this);
  }
  if ((seed == 0xdeadbeef) && (len == 1)) {
    return SliceStaticData::PrecalculatedHashesForDefaultSeed[**(byte **)this];
  }
  XVar1 = VELOCYPACK_XXH64(*(byte **)this,len,seed);
  return XVar1;
}

Assistant:

inline uint64_t hash(uint64_t seed = defaultSeed64) const {
    std::size_t const size = checkOverflow(byteSize());
    if (size == 1 && seed == defaultSeed64) {
      uint64_t h = SliceStaticData::PrecalculatedHashesForDefaultSeed[head()];
      VELOCYPACK_ASSERT(h != 0);
      return h;
    }
    return VELOCYPACK_HASH(start(), size, seed);
  }